

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O1

status webfront::http::std::experimental::net::v1::detail::
       reactive_socket_send_op_base<std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
       ::do_perform(reactor_op *base)

{
  int __fd;
  uint uVar1;
  int iVar2;
  error_category *peVar3;
  status sVar4;
  int *piVar5;
  size_t sVar6;
  error_category *peVar7;
  buffer_sequence_adapter<std::experimental::net::v1::const_buffer,_std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
  bufs;
  status local_484;
  msghdr local_478;
  buffer_sequence_adapter<std::experimental::net::v1::const_buffer,_std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
  local_440;
  
  buffer_sequence_adapter<std::experimental::net::v1::const_buffer,_std::experimental::net::v1::detail::prepared_buffers<std::experimental::net::v1::const_buffer,_64UL>_>
  ::buffer_sequence_adapter
            (&local_440,
             (prepared_buffers<std::experimental::net::v1::const_buffer,_64UL> *)
             &base[1].super_operation.func_);
  __fd = *(int *)&base[1].super_operation.next_;
  uVar1 = *(uint *)&base[5].perform_func_;
  piVar5 = __errno_location();
  local_484 = (status)piVar5;
  do {
    *piVar5 = 0;
    local_478.msg_control = (void *)0x0;
    local_478.msg_controllen = 0;
    local_478.msg_name = (void *)0x0;
    local_478.msg_namelen = 0;
    local_478._12_4_ = 0;
    local_478.msg_flags = 0;
    local_478._52_4_ = 0;
    local_478.msg_iov = (iovec *)&local_440;
    local_478.msg_iovlen = (long)(int)local_440.count_;
    sVar6 = sendmsg(__fd,&local_478,uVar1 | 0x4000);
    iVar2 = *piVar5;
    peVar7 = (error_category *)::std::_V2::system_category();
    (base->ec_)._M_value = iVar2;
    (base->ec_)._M_cat = peVar7;
    if (-1 < (long)sVar6) {
      (base->ec_)._M_value = 0;
      (base->ec_)._M_cat = peVar7;
    }
    peVar3 = (base->ec_)._M_cat;
    iVar2 = (base->ec_)._M_value;
    if (iVar2 != 4 || peVar3 != peVar7) {
      if (peVar3 == peVar7 && iVar2 == 0xb) {
        local_484 = not_done;
      }
      else {
        if ((long)sVar6 < 0) {
          sVar6 = 0;
        }
        else {
          (base->ec_)._M_value = 0;
          (base->ec_)._M_cat = peVar7;
        }
        base->bytes_transferred_ = sVar6;
        local_484 = done;
      }
    }
  } while (iVar2 == 4 && peVar3 == peVar7);
  sVar4 = local_484 & done;
  if ((((local_484 & done) != not_done) &&
      (((ulong)base[1].super_operation.next_ & 0x1000000000) != 0)) &&
     (base->bytes_transferred_ < local_440.total_buffer_size_)) {
    sVar4 = done_and_exhausted;
  }
  return sVar4;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_send_op_base* o(
        static_cast<reactive_socket_send_op_base*>(base));

    buffer_sequence_adapter<std::experimental::net::v1::const_buffer,
        ConstBufferSequence> bufs(o->buffers_);

    status result = socket_ops::non_blocking_send(o->socket_,
          bufs.buffers(), bufs.count(), o->flags_,
          o->ec_, o->bytes_transferred_) ? done : not_done;

    if (result == done)
      if ((o->state_ & socket_ops::stream_oriented) != 0)
        if (o->bytes_transferred_ < bufs.total_size())
          result = done_and_exhausted;

    NET_TS_HANDLER_REACTOR_OPERATION((*o, "non_blocking_send",
          o->ec_, o->bytes_transferred_));

    return result;
  }